

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_write.cpp
# Opt level: O0

void readvector(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *c,string *filename)

{
  byte bVar1;
  bool bVar2;
  ostream *this;
  istream *piVar3;
  long lVar4;
  ulong uVar5;
  char *pcVar6;
  string local_328 [32];
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [48];
  istream local_278 [8];
  ifstream b;
  int local_68;
  int j;
  int i;
  int l;
  int begin;
  int ignore;
  string stra;
  string local_38 [8];
  string str;
  string *filename_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *c_local;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string((string *)&begin);
  std::ifstream::ifstream(local_278);
  std::ifstream::open(local_278,filename,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    this = std::operator<<((ostream *)&std::cout,"\nfailure to read file");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  }
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_278,local_38);
    bVar2 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar2) break;
    lVar4 = std::__cxx11::string::find((char *)local_38,0x114064);
    if (lVar4 != -1) {
      std::__cxx11::string::find((char *)local_38,0x114064);
      std::__cxx11::string::substr((ulong)local_2a8,(ulong)local_38);
      std::__cxx11::string::operator=(local_38,local_2a8);
      std::__cxx11::string::~string(local_2a8);
    }
    for (local_68 = 0; uVar5 = std::__cxx11::string::length(), (ulong)(long)local_68 < uVar5;
        local_68 = local_68 + 1) {
      pcVar6 = (char *)std::__cxx11::string::at((ulong)local_38);
      if (*pcVar6 == ' ') {
        std::__cxx11::string::substr((ulong)local_2c8,(ulong)local_38);
        std::__cxx11::string::operator=((string *)&begin,local_2c8);
        std::__cxx11::string::~string(local_2c8);
        std::__cxx11::string::string(local_2e8,(string *)&begin);
        bVar2 = check_string((string *)local_2e8);
        std::__cxx11::string::~string(local_2e8);
        if (bVar2) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(c,(value_type *)&begin);
        }
      }
    }
    std::__cxx11::string::substr((ulong)local_308,(ulong)local_38);
    std::__cxx11::string::operator=((string *)&begin,local_308);
    std::__cxx11::string::~string(local_308);
    std::__cxx11::string::string(local_328,(string *)&begin);
    bVar2 = check_string((string *)local_328);
    std::__cxx11::string::~string(local_328);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(c,(value_type *)&begin);
    }
  }
  std::ifstream::close();
  std::ifstream::~ifstream(local_278);
  std::__cxx11::string::~string((string *)&begin);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void readvector(vector<string>& c,string filename)
{
	string str,stra;
	int ignore=0;
	int begin = 0;
	int l=0;
	int i = 0;
	int j = 0;
	ifstream b;
	b.open(filename);
	if (!b.is_open()) { cout << "\nfailure to read file" << endl; }
	while (getline(b, str))
	{
			if (str.find("//") != string::npos)
			{
				str = str.substr(0, str.find("//"));
			}
			for (i = 0; i < str.length(); i++)
			{
				l++;
				if (str.at(i) == ' ')
				{
					stra = str.substr(begin, l - 1);
					if (check_string( stra)) {
						c.push_back(stra);
						begin = i + 1;
						l = 0;
					}
					
				}
			}
			stra = str.substr(begin);
			if (check_string(stra))
			{
				c.push_back(stra);
			}
			l = 0;
			begin = 0;


	}
	b.close();

	return;
}